

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

TValue * lj_meta_cat(lua_State *L,TValue *top,int left)

{
  uint32_t uVar1;
  GCstr *pGVar2;
  char *str;
  cTValue *pcVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  size_t lenx;
  MSize sz;
  uint32_t *puVar10;
  
  uVar9 = (ulong)(uint)-left;
  if (0 < left) {
    uVar9 = (ulong)(uint)left;
  }
  do {
    iVar7 = (int)uVar9;
    pcVar3 = top + -1;
    uVar8 = *(uint *)((long)top + -4);
    if (uVar8 >= 0xffff0000 && uVar8 != 0xfffffffb) {
LAB_0010b8e6:
      pcVar3 = lj_meta_lookup(L,pcVar3,MM_concat);
      if (((pcVar3->field_2).it == 0xffffffff) &&
         (pcVar3 = lj_meta_lookup(L,top,MM_concat), (pcVar3->field_2).it == 0xffffffff)) {
        lj_err_optype(L,top + ((ulong)(uVar8 < 0xffff0000 || uVar8 == 0xfffffffb) - 1),LJ_ERR_OPCAT)
        ;
      }
      top[1] = top[-1];
      top[2].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)top;
      *top = *pcVar3;
      top[-1].n = 3.50588982288949e-320;
      return top + 1;
    }
    if ((top->field_2).it != 0xfffffffb) {
      if (0xfffeffff < (top->field_2).it) goto LAB_0010b8e6;
      pGVar2 = lj_str_fromnum(L,&top->n);
      (top->u32).lo = (uint32_t)pGVar2;
      (top->field_2).it = 0xfffffffb;
    }
    sz = *(MSize *)((ulong)(top->u32).lo + 0xc);
    if (sz == 0) {
      puVar10 = (uint32_t *)((long)top + -4);
      iVar4 = 1;
      if (*puVar10 < 0xffff0000) {
        pGVar2 = lj_str_fromnum(L,&pcVar3->n);
        (pcVar3->u32).lo = (uint32_t)pGVar2;
        iVar4 = 1;
        goto LAB_0010b8b8;
      }
    }
    else {
      uVar5 = 0;
      while (uVar6 = uVar9, uVar5 + 1 <= uVar9) {
        if ((pcVar3->field_2).it == 0xfffffffb) {
          uVar1 = (pcVar3->u32).lo;
        }
        else {
          uVar6 = uVar5;
          if (0xfffeffff < (pcVar3->field_2).it) break;
          pGVar2 = lj_str_fromnum(L,&pcVar3->n);
          uVar1 = (uint32_t)pGVar2;
          (pcVar3->u32).lo = uVar1;
          (pcVar3->field_2).it = 0xfffffffb;
        }
        if (0x7fffff00 - sz <= *(uint *)((ulong)uVar1 + 0xc)) {
          lj_err_msg(L,LJ_ERR_STROV);
        }
        sz = sz + *(uint *)((ulong)uVar1 + 0xc);
        pcVar3 = pcVar3 + -1;
        uVar5 = uVar5 + 1;
      }
      str = lj_str_needbuf(L,(SBuf *)((ulong)(L->glref).ptr32 + 0x58),sz);
      lenx = 0;
      iVar4 = (int)uVar6;
      uVar6 = uVar6 & 0xffffffff;
      while( true ) {
        if ((int)uVar6 < 0) break;
        uVar8 = *(uint *)((ulong)top[-uVar6].u32.lo + 0xc);
        memcpy(str + lenx,(void *)((ulong)top[-uVar6].u32.lo + 0x10),(ulong)uVar8);
        lenx = (size_t)((int)lenx + uVar8);
        uVar6 = (ulong)((int)uVar6 - 1);
      }
      pGVar2 = lj_str_new(L,str,lenx);
      top[-(long)iVar4].u32.lo = (uint32_t)pGVar2;
      puVar10 = &top[-(long)iVar4].field_2.it;
LAB_0010b8b8:
      *puVar10 = 0xfffffffb;
    }
    top = top + -(long)iVar4;
    uVar8 = iVar7 - iVar4;
    uVar9 = (ulong)uVar8;
    if (uVar8 == 0 || iVar7 < iVar4) {
      uVar9 = (ulong)(L->glref).ptr32;
      if (*(uint *)(uVar9 + 0x24) <= *(uint *)(uVar9 + 0x20)) {
        if (-1 < left) {
          L->top = L->base + *(byte *)((ulong)*(uint *)((ulong)L->base[-1].u32.lo + 0x10) - 0x39);
        }
        lj_gc_step(L);
      }
      return (TValue *)0x0;
    }
  } while( true );
}

Assistant:

TValue *lj_meta_cat(lua_State *L, TValue *top, int left)
{
  int fromc = 0;
  if (left < 0) { left = -left; fromc = 1; }
  do {
    int n = 1;
    if (!(tvisstr(top-1) || tvisnumber(top-1)) || !tostring(L, top)) {
      cTValue *mo = lj_meta_lookup(L, top-1, MM_concat);
      if (tvisnil(mo)) {
	mo = lj_meta_lookup(L, top, MM_concat);
	if (tvisnil(mo)) {
	  if (tvisstr(top-1) || tvisnumber(top-1)) top++;
	  lj_err_optype(L, top-1, LJ_ERR_OPCAT);
	  return NULL;  /* unreachable */
	}
      }
      /* One of the top two elements is not a string, call __cat metamethod:
      **
      ** before:    [...][CAT stack .........................]
      **                                 top-1     top         top+1 top+2
      ** pick two:  [...][CAT stack ...] [o1]      [o2]
      ** setup mm:  [...][CAT stack ...] [cont|?]  [mo|tmtype] [o1]  [o2]
      ** in asm:    [...][CAT stack ...] [cont|PC] [mo|delta]  [o1]  [o2]
      **            ^-- func base                              ^-- mm base
      ** after mm:  [...][CAT stack ...] <--push-- [result]
      ** next step: [...][CAT stack .............]
      */
      copyTV(L, top+2, top);  /* Careful with the order of stack copies! */
      copyTV(L, top+1, top-1);
      copyTV(L, top, mo);
      setcont(top-1, lj_cont_cat);
      return top+1;  /* Trigger metamethod call. */
    } else if (strV(top)->len == 0) {  /* Shortcut. */
      (void)tostring(L, top-1);
    } else {
      /* Pick as many strings as possible from the top and concatenate them:
      **
      ** before:    [...][CAT stack ...........................]
      ** pick str:  [...][CAT stack ...] [...... strings ......]
      ** concat:    [...][CAT stack ...] [result]
      ** next step: [...][CAT stack ............]
      */
      MSize tlen = strV(top)->len;
      char *buffer;
      int i;
      for (n = 1; n <= left && tostring(L, top-n); n++) {
	MSize len = strV(top-n)->len;
	if (len >= LJ_MAX_STR - tlen)
	  lj_err_msg(L, LJ_ERR_STROV);
	tlen += len;
      }
      buffer = lj_str_needbuf(L, &G(L)->tmpbuf, tlen);
      n--;
      tlen = 0;
      for (i = n; i >= 0; i--) {
	MSize len = strV(top-i)->len;
	memcpy(buffer + tlen, strVdata(top-i), len);
	tlen += len;
      }
      setstrV(L, top-n, lj_str_new(L, buffer, tlen));
    }
    left -= n;
    top -= n;
  } while (left >= 1);
  if (LJ_UNLIKELY(G(L)->gc.total >= G(L)->gc.threshold)) {
    if (!fromc) L->top = curr_topL(L);
    lj_gc_step(L);
  }
  return NULL;
}